

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_fma.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_fma_functor::unary_op_abs>(Mat *a,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  unary_op_abs *this;
  long *in_RDI;
  float fVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  __m128 afVar8;
  __m128 _p_1;
  __m256 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_abs op;
  Mat *m;
  float *in_stack_fffffffffffffda0;
  unary_op_abs *this_00;
  float local_230 [2];
  float afStack_228 [2];
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  int local_1f0;
  undefined8 local_1e0;
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined4 local_1c8;
  long local_1c0;
  undefined4 local_1b8;
  undefined4 local_1b4;
  undefined4 local_1b0;
  undefined4 local_1ac;
  undefined4 local_1a8;
  undefined8 local_1a0;
  unary_op_abs *local_198;
  int local_190;
  int local_18c;
  int local_188;
  int local_184;
  int local_180;
  int local_17c;
  int local_178;
  unary_op_abs local_171 [9];
  long *local_168;
  undefined1 local_15d;
  int local_15c;
  undefined8 *local_150;
  undefined8 *local_148;
  unary_op_abs *local_138;
  unary_op_abs *local_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  unary_op_abs *local_f0;
  unary_op_abs *local_e8;
  float local_e0 [2];
  float afStack_d8 [4];
  unary_op_abs *local_c8;
  long local_c0;
  undefined4 local_b4;
  long local_b0;
  unary_op_abs *local_a8;
  undefined4 local_9c;
  int local_98;
  int local_94;
  undefined8 *local_90;
  undefined4 local_84;
  long local_80;
  unary_op_abs *local_60;
  
  local_178 = *(int *)((long)in_RDI + 0x2c);
  local_17c = (int)in_RDI[6];
  local_180 = *(int *)((long)in_RDI + 0x34);
  local_184 = (int)in_RDI[7];
  local_188 = (int)in_RDI[3];
  local_18c = local_178 * local_17c * local_180 * local_188;
  local_168 = in_RDI;
  for (local_190 = 0; local_190 < local_184; local_190 = local_190 + 1) {
    local_150 = &local_1e0;
    local_94 = *(int *)((long)local_168 + 0x2c);
    local_98 = (int)local_168[6];
    local_9c = *(undefined4 *)((long)local_168 + 0x34);
    this = (unary_op_abs *)(*local_168 + local_168[8] * (long)local_190 * local_168[2]);
    local_b0 = local_168[2];
    local_b4 = (undefined4)local_168[3];
    local_c0 = local_168[4];
    local_90 = &local_1e0;
    local_80 = (long)local_94 * (long)local_98 * local_b0;
    local_148 = &local_1e0;
    this_00 = (unary_op_abs *)&local_1e0;
    local_84 = 0x10;
    local_15c = local_190;
    local_15d = 1;
    local_1e0 = 0;
    local_1d0 = 0;
    local_1c8 = 0;
    local_1b8 = 0;
    local_1b4 = 0;
    local_1b0 = 0;
    local_1ac = 0;
    local_1a8 = 0;
    local_1a0 = 0;
    local_1d8 = 0;
    local_198 = this;
    local_138 = this_00;
    local_a8 = this;
    local_60 = this_00;
    local_1c0 = local_c0;
    for (local_1f0 = 0; local_1f0 + 7 < local_18c; local_1f0 = local_1f0 + 8) {
      local_128 = local_198;
      uVar5 = *(undefined8 *)local_198;
      uVar4 = *(undefined8 *)(local_198 + 8);
      uVar6 = *(undefined8 *)(local_198 + 0x10);
      uVar7 = *(undefined8 *)(local_198 + 0x18);
      local_220 = uVar5;
      uStack_218 = uVar4;
      uStack_210 = uVar6;
      uStack_208 = uVar7;
      UnaryOp_x86_fma_functor::unary_op_abs::func_pack8(this,(__m256 *)this_00);
      local_f0 = local_198;
      auVar1._8_8_ = uVar4;
      auVar1._0_8_ = uVar5;
      auVar1._16_8_ = uVar6;
      auVar1._24_8_ = uVar7;
      *(undefined1 (*) [32])local_198 = auVar1;
      local_198 = local_198 + 0x20;
      local_220 = uVar5;
      uStack_218 = uVar4;
      uStack_210 = uVar6;
      uStack_208 = uVar7;
      local_120 = uVar5;
      uStack_118 = uVar4;
      uStack_110 = uVar6;
      uStack_108 = uVar7;
    }
    for (; local_1f0 + 3 < local_18c; local_1f0 = local_1f0 + 4) {
      local_e8 = local_198;
      local_230 = *(float (*) [2])local_198;
      uVar5 = *(undefined8 *)(local_198 + 8);
      afStack_228 = (float  [2])uVar5;
      afVar8 = UnaryOp_x86_fma_functor::unary_op_abs::func_pack4(local_171,(__m128 *)local_230);
      local_230 = afVar8._0_8_;
      local_c8 = local_198;
      auVar2._8_4_ = (float)uVar5;
      auVar2._12_4_ = SUB84(uVar5,4);
      auVar2._0_4_ = local_230[0];
      auVar2._4_4_ = local_230[1];
      *(undefined1 (*) [16])local_198 = auVar2;
      local_198 = local_198 + 0x10;
      afStack_228 = (float  [2])uVar5;
      local_e0 = local_230;
      afStack_d8._0_8_ = uVar5;
    }
    for (; local_1f0 < local_18c; local_1f0 = local_1f0 + 1) {
      fVar3 = UnaryOp_x86_fma_functor::unary_op_abs::func(this_00,in_stack_fffffffffffffda0);
      *(float *)local_198 = fVar3;
      local_198 = local_198 + 4;
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}